

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  bool bVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  byte bVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  ulong *puVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  vint4 bi;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  vint4 ai;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  uint uVar77;
  uint uVar78;
  uint uVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_cd0;
  undefined1 local_ca0 [32];
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined4 local_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  undefined4 local_b60;
  undefined4 uStack_b5c;
  undefined4 uStack_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar48 = local_7f8;
  local_800 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar95 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_c10._4_4_ = fVar3;
  local_c10._0_4_ = fVar3;
  local_c10._8_4_ = fVar3;
  local_c10._12_4_ = fVar3;
  auVar65 = ZEXT1664(local_c10);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_c20._4_4_ = fVar80;
  local_c20._0_4_ = fVar80;
  local_c20._8_4_ = fVar80;
  local_c20._12_4_ = fVar80;
  auVar66 = ZEXT1664(local_c20);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar80 = fVar80 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_c30._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_c30._8_4_ = -fVar2;
  local_c30._12_4_ = -fVar2;
  auVar67 = ZEXT1664(local_c30);
  local_c40._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_c40._8_4_ = -fVar3;
  local_c40._12_4_ = -fVar3;
  auVar70 = ZEXT1664(local_c40);
  iVar40 = (tray->tnear).field_0.i[k];
  local_c50._4_4_ = iVar40;
  local_c50._0_4_ = iVar40;
  local_c50._8_4_ = iVar40;
  local_c50._12_4_ = iVar40;
  auVar75 = ZEXT1664(local_c50);
  iVar40 = (tray->tfar).field_0.i[k];
  local_c60._4_4_ = iVar40;
  local_c60._0_4_ = iVar40;
  local_c60._8_4_ = iVar40;
  local_c60._12_4_ = iVar40;
  auVar76 = ZEXT1664(local_c60);
  local_ba0._16_16_ = mm_lookupmask_ps._240_16_;
  local_ba0._0_16_ = mm_lookupmask_ps._0_16_;
  local_c70._0_8_ = CONCAT44(fVar80,fVar80) ^ 0x8000000080000000;
  local_c70._8_4_ = -fVar80;
  local_c70._12_4_ = -fVar80;
  auVar64 = ZEXT1664(local_c70);
  iVar40 = 1 << ((uint)k & 0x1f);
  auVar74._4_4_ = iVar40;
  auVar74._0_4_ = iVar40;
  auVar74._8_4_ = iVar40;
  auVar74._12_4_ = iVar40;
  auVar74._16_4_ = iVar40;
  auVar74._20_4_ = iVar40;
  auVar74._24_4_ = iVar40;
  auVar74._28_4_ = iVar40;
  auVar55 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar74 = vpand_avx2(auVar74,auVar55);
  local_be0 = vpcmpeqd_avx2(auVar74,auVar55);
  bVar39 = true;
  local_b60 = 0x7fffffff;
  uStack_b5c = 0x7fffffff;
  uStack_b58 = 0x7fffffff;
  uStack_b54 = 0x7fffffff;
  uStack_b50 = 0x7fffffff;
  uStack_b4c = 0x7fffffff;
  uStack_b48 = 0x7fffffff;
  uStack_b44 = 0x7fffffff;
  local_b80 = 0x80000000;
  uStack_b7c = 0x80000000;
  uStack_b78 = 0x80000000;
  uStack_b74 = 0x80000000;
  uStack_b70 = 0x80000000;
  uStack_b6c = 0x80000000;
  uStack_b68 = 0x80000000;
  uStack_b64 = 0x80000000;
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = 0x3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar57._16_4_ = 0x3f800000;
  auVar57._20_4_ = 0x3f800000;
  auVar57._24_4_ = 0x3f800000;
  auVar57._28_4_ = 0x3f800000;
  auVar55._8_4_ = 0xbf800000;
  auVar55._0_8_ = 0xbf800000bf800000;
  auVar55._12_4_ = 0xbf800000;
  auVar55._16_4_ = 0xbf800000;
  auVar55._20_4_ = 0xbf800000;
  auVar55._24_4_ = 0xbf800000;
  auVar55._28_4_ = 0xbf800000;
  local_bc0 = vblendvps_avx(auVar57,auVar55,local_ba0);
  do {
    uVar44 = puVar48[-1];
    puVar48 = puVar48 + -1;
    while ((uVar44 & 8) == 0) {
      auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar49),auVar67._0_16_,
                                auVar95._0_16_);
      auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar51),auVar70._0_16_,
                                auVar65._0_16_);
      auVar54 = vpmaxsd_avx(auVar54,auVar27);
      auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar50),auVar64._0_16_,
                                auVar66._0_16_);
      auVar27 = vpmaxsd_avx(auVar27,auVar75._0_16_);
      auVar54 = vpmaxsd_avx(auVar54,auVar27);
      auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar49 ^ 0x10)),
                                auVar67._0_16_,auVar95._0_16_);
      auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar51 ^ 0x10)),
                                auVar70._0_16_,auVar65._0_16_);
      auVar27 = vpminsd_avx(auVar27,auVar28);
      auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar50 ^ 0x10)),
                                auVar64._0_16_,auVar66._0_16_);
      auVar28 = vpminsd_avx(auVar28,auVar76._0_16_);
      auVar27 = vpminsd_avx(auVar27,auVar28);
      auVar54 = vpcmpgtd_avx(auVar54,auVar27);
      iVar40 = vmovmskps_avx(auVar54);
      if (iVar40 == 0xf) goto joined_r0x00578abd;
      bVar43 = (byte)iVar40 ^ 0xf;
      uVar52 = uVar44 & 0xfffffffffffffff0;
      lVar42 = 0;
      for (uVar44 = (ulong)bVar43; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
        lVar42 = lVar42 + 1;
      }
      uVar44 = *(ulong *)(uVar52 + lVar42 * 8);
      uVar47 = bVar43 - 1 & (uint)bVar43;
      uVar46 = (ulong)uVar47;
      if (uVar47 != 0) {
        *puVar48 = uVar44;
        lVar42 = 0;
        for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
          lVar42 = lVar42 + 1;
        }
        uVar47 = uVar47 - 1 & uVar47;
        uVar46 = (ulong)uVar47;
        bVar53 = uVar47 == 0;
        while( true ) {
          puVar48 = puVar48 + 1;
          uVar44 = *(ulong *)(uVar52 + lVar42 * 8);
          if (bVar53) break;
          *puVar48 = uVar44;
          lVar42 = 0;
          for (uVar44 = uVar46; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
            lVar42 = lVar42 + 1;
          }
          uVar46 = uVar46 - 1 & uVar46;
          bVar53 = uVar46 == 0;
        }
      }
    }
    uVar52 = (ulong)((uint)uVar44 & 0xf);
    if (uVar52 != 8) {
      uVar44 = uVar44 & 0xfffffffffffffff0;
      lVar42 = 0;
      do {
        lVar41 = lVar42 * 0x60;
        pSVar6 = context->scene;
        ppfVar7 = (pSVar6->vertices).items;
        pfVar8 = ppfVar7[*(uint *)(uVar44 + 0x48 + lVar41)];
        auVar59._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar44 + 0x28 + lVar41));
        auVar59._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar44 + 8 + lVar41));
        pfVar9 = ppfVar7[*(uint *)(uVar44 + 0x40 + lVar41)];
        auVar62._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar44 + 0x20 + lVar41));
        auVar62._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar44 + lVar41));
        pfVar10 = ppfVar7[*(uint *)(uVar44 + 0x44 + lVar41)];
        auVar69._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar44 + 0x24 + lVar41));
        auVar69._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar44 + 4 + lVar41));
        pfVar11 = ppfVar7[*(uint *)(uVar44 + 0x4c + lVar41)];
        auVar86._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar44 + 0x2c + lVar41));
        auVar86._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar44 + 0xc + lVar41));
        lVar1 = uVar44 + 0x40 + lVar41;
        local_b20 = *(undefined8 *)(lVar1 + 0x10);
        uStack_b18 = *(undefined8 *)(lVar1 + 0x18);
        uStack_b10 = local_b20;
        uStack_b08 = uStack_b18;
        lVar1 = uVar44 + 0x50 + lVar41;
        local_b40 = *(undefined8 *)(lVar1 + 0x10);
        uStack_b38 = *(undefined8 *)(lVar1 + 0x18);
        auVar28 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar44 + 0x10 + lVar41)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar44 + 0x18 + lVar41)));
        auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar44 + 0x10 + lVar41)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar44 + 0x18 + lVar41)));
        auVar20 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar44 + 0x14 + lVar41)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar44 + 0x1c + lVar41)))
        ;
        auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar44 + 0x14 + lVar41)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar44 + 0x1c + lVar41)))
        ;
        auVar21 = vunpcklps_avx(auVar54,auVar27);
        auVar22 = vunpcklps_avx(auVar28,auVar20);
        auVar54 = vunpckhps_avx(auVar28,auVar20);
        auVar20 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar44 + 0x30 + lVar41)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar44 + 0x38 + lVar41)));
        auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar44 + 0x30 + lVar41)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar44 + 0x38 + lVar41)));
        auVar23 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar44 + 0x34 + lVar41)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar44 + 0x3c + lVar41)))
        ;
        auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar44 + 0x34 + lVar41)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar44 + 0x3c + lVar41)))
        ;
        auVar28 = vunpcklps_avx(auVar27,auVar28);
        auVar24 = vunpcklps_avx(auVar20,auVar23);
        auVar27 = vunpckhps_avx(auVar20,auVar23);
        uStack_b30 = local_b40;
        uStack_b28 = uStack_b38;
        auVar74 = vunpcklps_avx(auVar69,auVar86);
        auVar55 = vunpcklps_avx(auVar62,auVar59);
        auVar25 = vunpcklps_avx(auVar55,auVar74);
        auVar19 = vunpckhps_avx(auVar55,auVar74);
        auVar74 = vunpckhps_avx(auVar69,auVar86);
        auVar55 = vunpckhps_avx(auVar62,auVar59);
        auVar59 = vunpcklps_avx(auVar55,auVar74);
        auVar60._16_16_ = auVar22;
        auVar60._0_16_ = auVar22;
        auVar63._16_16_ = auVar54;
        auVar63._0_16_ = auVar54;
        auVar58._16_16_ = auVar21;
        auVar58._0_16_ = auVar21;
        auVar83._16_16_ = auVar24;
        auVar83._0_16_ = auVar24;
        auVar87._16_16_ = auVar27;
        auVar87._0_16_ = auVar27;
        auVar56._16_16_ = auVar28;
        auVar56._0_16_ = auVar28;
        auVar55 = vsubps_avx(auVar25,auVar60);
        auVar74 = vsubps_avx(auVar19,auVar63);
        auVar57 = vsubps_avx(auVar59,auVar58);
        auVar16 = vsubps_avx(auVar83,auVar25);
        auVar17 = vsubps_avx(auVar87,auVar19);
        auVar18 = vsubps_avx(auVar56,auVar59);
        auVar29._4_4_ = auVar18._4_4_ * auVar74._4_4_;
        auVar29._0_4_ = auVar18._0_4_ * auVar74._0_4_;
        auVar29._8_4_ = auVar18._8_4_ * auVar74._8_4_;
        auVar29._12_4_ = auVar18._12_4_ * auVar74._12_4_;
        auVar29._16_4_ = auVar18._16_4_ * auVar74._16_4_;
        auVar29._20_4_ = auVar18._20_4_ * auVar74._20_4_;
        auVar29._24_4_ = auVar18._24_4_ * auVar74._24_4_;
        auVar29._28_4_ = auVar28._12_4_;
        auVar20 = vfmsub231ps_fma(auVar29,auVar17,auVar57);
        auVar30._4_4_ = auVar57._4_4_ * auVar16._4_4_;
        auVar30._0_4_ = auVar57._0_4_ * auVar16._0_4_;
        auVar30._8_4_ = auVar57._8_4_ * auVar16._8_4_;
        auVar30._12_4_ = auVar57._12_4_ * auVar16._12_4_;
        auVar30._16_4_ = auVar57._16_4_ * auVar16._16_4_;
        auVar30._20_4_ = auVar57._20_4_ * auVar16._20_4_;
        auVar30._24_4_ = auVar57._24_4_ * auVar16._24_4_;
        auVar30._28_4_ = auVar21._12_4_;
        auVar21 = vfmsub231ps_fma(auVar30,auVar18,auVar55);
        uVar4 = *(undefined4 *)(ray + k * 4);
        auVar89._4_4_ = uVar4;
        auVar89._0_4_ = uVar4;
        auVar89._8_4_ = uVar4;
        auVar89._12_4_ = uVar4;
        auVar89._16_4_ = uVar4;
        auVar89._20_4_ = uVar4;
        auVar89._24_4_ = uVar4;
        auVar89._28_4_ = uVar4;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar91._4_4_ = uVar4;
        auVar91._0_4_ = uVar4;
        auVar91._8_4_ = uVar4;
        auVar91._12_4_ = uVar4;
        auVar91._16_4_ = uVar4;
        auVar91._20_4_ = uVar4;
        auVar91._24_4_ = uVar4;
        auVar91._28_4_ = uVar4;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar93._4_4_ = uVar4;
        auVar93._0_4_ = uVar4;
        auVar93._8_4_ = uVar4;
        auVar93._12_4_ = uVar4;
        auVar93._16_4_ = uVar4;
        auVar93._20_4_ = uVar4;
        auVar93._24_4_ = uVar4;
        auVar93._28_4_ = uVar4;
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar84._4_4_ = fVar2;
        auVar84._0_4_ = fVar2;
        auVar84._8_4_ = fVar2;
        auVar84._12_4_ = fVar2;
        auVar84._16_4_ = fVar2;
        auVar84._20_4_ = fVar2;
        auVar84._24_4_ = fVar2;
        auVar84._28_4_ = fVar2;
        auVar25 = vsubps_avx(auVar25,auVar89);
        fVar3 = *(float *)(ray + k * 4 + 0xa0);
        auVar90._4_4_ = fVar3;
        auVar90._0_4_ = fVar3;
        auVar90._8_4_ = fVar3;
        auVar90._12_4_ = fVar3;
        auVar90._16_4_ = fVar3;
        auVar90._20_4_ = fVar3;
        auVar90._24_4_ = fVar3;
        auVar90._28_4_ = fVar3;
        auVar19 = vsubps_avx(auVar19,auVar91);
        fVar80 = *(float *)(ray + k * 4 + 0xc0);
        auVar92._4_4_ = fVar80;
        auVar92._0_4_ = fVar80;
        auVar92._8_4_ = fVar80;
        auVar92._12_4_ = fVar80;
        auVar92._16_4_ = fVar80;
        auVar92._20_4_ = fVar80;
        auVar92._24_4_ = fVar80;
        auVar92._28_4_ = fVar80;
        auVar59 = vsubps_avx(auVar59,auVar93);
        auVar31._4_4_ = fVar2 * auVar19._4_4_;
        auVar31._0_4_ = fVar2 * auVar19._0_4_;
        auVar31._8_4_ = fVar2 * auVar19._8_4_;
        auVar31._12_4_ = fVar2 * auVar19._12_4_;
        auVar31._16_4_ = fVar2 * auVar19._16_4_;
        auVar31._20_4_ = fVar2 * auVar19._20_4_;
        auVar31._24_4_ = fVar2 * auVar19._24_4_;
        auVar31._28_4_ = uVar4;
        auVar54 = vfmsub231ps_fma(auVar31,auVar25,auVar90);
        auVar32._4_4_ = auVar18._4_4_ * auVar54._4_4_;
        auVar32._0_4_ = auVar18._0_4_ * auVar54._0_4_;
        auVar32._8_4_ = auVar18._8_4_ * auVar54._8_4_;
        auVar32._12_4_ = auVar18._12_4_ * auVar54._12_4_;
        auVar32._16_4_ = auVar18._16_4_ * 0.0;
        auVar32._20_4_ = auVar18._20_4_ * 0.0;
        auVar32._24_4_ = auVar18._24_4_ * 0.0;
        auVar32._28_4_ = auVar18._28_4_;
        auVar94._0_4_ = auVar57._0_4_ * auVar54._0_4_;
        auVar94._4_4_ = auVar57._4_4_ * auVar54._4_4_;
        auVar94._8_4_ = auVar57._8_4_ * auVar54._8_4_;
        auVar94._12_4_ = auVar57._12_4_ * auVar54._12_4_;
        auVar94._16_4_ = auVar57._16_4_ * 0.0;
        auVar94._20_4_ = auVar57._20_4_ * 0.0;
        auVar94._24_4_ = auVar57._24_4_ * 0.0;
        auVar94._28_4_ = 0;
        auVar18._4_4_ = fVar80 * auVar25._4_4_;
        auVar18._0_4_ = fVar80 * auVar25._0_4_;
        auVar18._8_4_ = fVar80 * auVar25._8_4_;
        auVar18._12_4_ = fVar80 * auVar25._12_4_;
        auVar18._16_4_ = fVar80 * auVar25._16_4_;
        auVar18._20_4_ = fVar80 * auVar25._20_4_;
        auVar18._24_4_ = fVar80 * auVar25._24_4_;
        auVar18._28_4_ = auVar57._28_4_;
        auVar27 = vfmsub231ps_fma(auVar18,auVar59,auVar84);
        auVar54 = vfmadd231ps_fma(auVar32,ZEXT1632(auVar27),auVar17);
        auVar27 = vfmadd231ps_fma(auVar94,auVar74,ZEXT1632(auVar27));
        auVar33._4_4_ = auVar55._4_4_ * auVar17._4_4_;
        auVar33._0_4_ = auVar55._0_4_ * auVar17._0_4_;
        auVar33._8_4_ = auVar55._8_4_ * auVar17._8_4_;
        auVar33._12_4_ = auVar55._12_4_ * auVar17._12_4_;
        auVar33._16_4_ = auVar55._16_4_ * auVar17._16_4_;
        auVar33._20_4_ = auVar55._20_4_ * auVar17._20_4_;
        auVar33._24_4_ = auVar55._24_4_ * auVar17._24_4_;
        auVar33._28_4_ = auVar17._28_4_;
        auVar22 = vfmsub231ps_fma(auVar33,auVar16,auVar74);
        auVar17._4_4_ = fVar3 * auVar59._4_4_;
        auVar17._0_4_ = fVar3 * auVar59._0_4_;
        auVar17._8_4_ = fVar3 * auVar59._8_4_;
        auVar17._12_4_ = fVar3 * auVar59._12_4_;
        auVar17._16_4_ = fVar3 * auVar59._16_4_;
        auVar17._20_4_ = fVar3 * auVar59._20_4_;
        auVar17._24_4_ = fVar3 * auVar59._24_4_;
        auVar17._28_4_ = auVar74._28_4_;
        auVar23 = vfmsub231ps_fma(auVar17,auVar19,auVar92);
        fVar2 = auVar22._0_4_;
        fVar3 = auVar22._4_4_;
        auVar34._4_4_ = fVar80 * fVar3;
        auVar34._0_4_ = fVar80 * fVar2;
        fVar14 = auVar22._8_4_;
        auVar34._8_4_ = fVar80 * fVar14;
        fVar15 = auVar22._12_4_;
        auVar34._12_4_ = fVar80 * fVar15;
        auVar34._16_4_ = fVar80 * 0.0;
        auVar34._20_4_ = fVar80 * 0.0;
        auVar34._24_4_ = fVar80 * 0.0;
        auVar34._28_4_ = fVar80;
        auVar28 = vfmadd231ps_fma(auVar34,ZEXT1632(auVar21),auVar90);
        auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),ZEXT1632(auVar20),auVar84);
        auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar23),auVar16);
        auVar16._4_4_ = uStack_b7c;
        auVar16._0_4_ = local_b80;
        auVar16._8_4_ = uStack_b78;
        auVar16._12_4_ = uStack_b74;
        auVar16._16_4_ = uStack_b70;
        auVar16._20_4_ = uStack_b6c;
        auVar16._24_4_ = uStack_b68;
        auVar16._28_4_ = uStack_b64;
        auVar74 = vandps_avx(ZEXT1632(auVar28),auVar16);
        uVar47 = auVar74._0_4_;
        local_b00._0_4_ = (float)(uVar47 ^ auVar54._0_4_);
        uVar77 = auVar74._4_4_;
        local_b00._4_4_ = (float)(uVar77 ^ auVar54._4_4_);
        uVar78 = auVar74._8_4_;
        local_b00._8_4_ = (float)(uVar78 ^ auVar54._8_4_);
        uVar79 = auVar74._12_4_;
        local_b00._12_4_ = (float)(uVar79 ^ auVar54._12_4_);
        fVar80 = auVar74._16_4_;
        local_b00._16_4_ = fVar80;
        fVar81 = auVar74._20_4_;
        local_b00._20_4_ = fVar81;
        fVar82 = auVar74._24_4_;
        local_b00._24_4_ = fVar82;
        fStack_9a4 = auVar74._28_4_;
        local_b00._28_4_ = fStack_9a4;
        auVar54 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar55,ZEXT1632(auVar23));
        local_ae0._0_4_ = (float)(uVar47 ^ auVar54._0_4_);
        local_ae0._4_4_ = (float)(uVar77 ^ auVar54._4_4_);
        local_ae0._8_4_ = (float)(uVar78 ^ auVar54._8_4_);
        local_ae0._12_4_ = (float)(uVar79 ^ auVar54._12_4_);
        local_ae0._16_4_ = fVar80;
        local_ae0._20_4_ = fVar81;
        local_ae0._24_4_ = fVar82;
        local_ae0._28_4_ = fStack_9a4;
        auVar74 = vcmpps_avx(local_b00,ZEXT832(0) << 0x20,5);
        auVar55 = vcmpps_avx(local_ae0,ZEXT832(0) << 0x20,5);
        auVar74 = vandps_avx(auVar55,auVar74);
        auVar38._4_4_ = uStack_b5c;
        auVar38._0_4_ = local_b60;
        auVar38._8_4_ = uStack_b58;
        auVar38._12_4_ = uStack_b54;
        auVar38._16_4_ = uStack_b50;
        auVar38._20_4_ = uStack_b4c;
        auVar38._24_4_ = uStack_b48;
        auVar38._28_4_ = uStack_b44;
        local_aa0 = vandps_avx(ZEXT1632(auVar28),auVar38);
        auVar55 = vcmpps_avx(ZEXT1632(auVar28),ZEXT832(0) << 0x20,4);
        auVar74 = vandps_avx(auVar74,auVar55);
        auVar88._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
        auVar88._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
        auVar88._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
        auVar88._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
        auVar88._16_4_ = fVar80 + fVar80;
        auVar88._20_4_ = fVar81 + fVar81;
        auVar88._24_4_ = fVar82 + fVar82;
        auVar88._28_4_ = fStack_9a4 + fStack_9a4;
        auVar55 = vcmpps_avx(auVar88,local_aa0,2);
        auVar57 = auVar55 & auVar74;
        if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar57 >> 0x7f,0) != '\0') ||
              (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar57 >> 0xbf,0) != '\0') ||
            (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar57[0x1f] < '\0') {
          auVar74 = vandps_avx(auVar74,auVar55);
          auVar54 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
          auVar35._4_4_ = auVar59._4_4_ * fVar3;
          auVar35._0_4_ = auVar59._0_4_ * fVar2;
          auVar35._8_4_ = auVar59._8_4_ * fVar14;
          auVar35._12_4_ = auVar59._12_4_ * fVar15;
          auVar35._16_4_ = auVar59._16_4_ * 0.0;
          auVar35._20_4_ = auVar59._20_4_ * 0.0;
          auVar35._24_4_ = auVar59._24_4_ * 0.0;
          auVar35._28_4_ = auVar59._28_4_;
          auVar27 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar21),auVar35);
          auVar27 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar20),ZEXT1632(auVar27));
          local_ac0._0_4_ = (float)(uVar47 ^ auVar27._0_4_);
          local_ac0._4_4_ = (float)(uVar77 ^ auVar27._4_4_);
          local_ac0._8_4_ = (float)(uVar78 ^ auVar27._8_4_);
          local_ac0._12_4_ = (float)(uVar79 ^ auVar27._12_4_);
          local_ac0._16_4_ = fVar80;
          local_ac0._20_4_ = fVar81;
          local_ac0._24_4_ = fVar82;
          local_ac0._28_4_ = fStack_9a4;
          fVar68 = *(float *)(ray + k * 4 + 0x60);
          auVar25._4_4_ = local_aa0._4_4_ * fVar68;
          auVar25._0_4_ = local_aa0._0_4_ * fVar68;
          auVar25._8_4_ = local_aa0._8_4_ * fVar68;
          auVar25._12_4_ = local_aa0._12_4_ * fVar68;
          auVar25._16_4_ = local_aa0._16_4_ * fVar68;
          auVar25._20_4_ = local_aa0._20_4_ * fVar68;
          auVar25._24_4_ = local_aa0._24_4_ * fVar68;
          auVar25._28_4_ = fVar68;
          auVar74 = vcmpps_avx(auVar25,local_ac0,1);
          fVar68 = *(float *)(ray + k * 4 + 0x100);
          auVar64 = ZEXT3264(CONCAT428(fVar68,CONCAT424(fVar68,CONCAT420(fVar68,CONCAT416(fVar68,
                                                  CONCAT412(fVar68,CONCAT48(fVar68,CONCAT44(fVar68,
                                                  fVar68))))))));
          auVar19._4_4_ = fVar68 * local_aa0._4_4_;
          auVar19._0_4_ = fVar68 * local_aa0._0_4_;
          auVar19._8_4_ = fVar68 * local_aa0._8_4_;
          auVar19._12_4_ = fVar68 * local_aa0._12_4_;
          auVar19._16_4_ = fVar68 * local_aa0._16_4_;
          auVar19._20_4_ = fVar68 * local_aa0._20_4_;
          auVar19._24_4_ = fVar68 * local_aa0._24_4_;
          auVar19._28_4_ = auVar59._28_4_;
          auVar55 = vcmpps_avx(local_ac0,auVar19,2);
          auVar74 = vandps_avx(auVar55,auVar74);
          auVar27 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
          auVar54 = vpand_avx(auVar54,auVar27);
          auVar74 = vpmovzxwd_avx2(auVar54);
          auVar74 = vpslld_avx2(auVar74,0x1f);
          if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar74 >> 0x7f,0) != '\0') ||
                (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar74 >> 0xbf,0) != '\0') ||
              (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar74[0x1f] < '\0') {
            local_a20 = vpsrad_avx2(auVar74,0x1f);
            local_a80 = ZEXT1632(auVar20);
            local_a60 = ZEXT1632(auVar21);
            local_a40 = ZEXT1632(auVar22);
            auVar74 = vrcpps_avx(local_aa0);
            local_940 = local_ba0;
            auVar85._8_4_ = 0x3f800000;
            auVar85._0_8_ = 0x3f8000003f800000;
            auVar85._12_4_ = 0x3f800000;
            auVar85._16_4_ = 0x3f800000;
            auVar85._20_4_ = 0x3f800000;
            auVar85._24_4_ = 0x3f800000;
            auVar85._28_4_ = 0x3f800000;
            auVar27 = vfnmadd213ps_fma(local_aa0,auVar74,auVar85);
            auVar27 = vfmadd132ps_fma(ZEXT1632(auVar27),auVar74,auVar74);
            fVar68 = auVar27._0_4_;
            fVar71 = auVar27._4_4_;
            fVar72 = auVar27._8_4_;
            fVar73 = auVar27._12_4_;
            local_9c0[0] = fVar68 * local_ac0._0_4_;
            local_9c0[1] = fVar71 * local_ac0._4_4_;
            local_9c0[2] = fVar72 * local_ac0._8_4_;
            local_9c0[3] = fVar73 * local_ac0._12_4_;
            fStack_9b0 = fVar80 * 0.0;
            fStack_9ac = fVar81 * 0.0;
            fStack_9a8 = fVar82 * 0.0;
            auVar36._4_4_ = fVar71 * local_b00._4_4_;
            auVar36._0_4_ = fVar68 * local_b00._0_4_;
            auVar36._8_4_ = fVar72 * local_b00._8_4_;
            auVar36._12_4_ = fVar73 * local_b00._12_4_;
            auVar36._16_4_ = fVar80 * 0.0;
            auVar36._20_4_ = fVar81 * 0.0;
            auVar36._24_4_ = fVar82 * 0.0;
            auVar36._28_4_ = fStack_9a4;
            auVar74 = vminps_avx(auVar36,auVar85);
            auVar37._4_4_ = fVar71 * local_ae0._4_4_;
            auVar37._0_4_ = fVar68 * local_ae0._0_4_;
            auVar37._8_4_ = fVar72 * local_ae0._8_4_;
            auVar37._12_4_ = fVar73 * local_ae0._12_4_;
            auVar37._16_4_ = fVar80 * 0.0;
            auVar37._20_4_ = fVar81 * 0.0;
            auVar37._24_4_ = fVar82 * 0.0;
            auVar37._28_4_ = fStack_9a4;
            auVar55 = vminps_avx(auVar37,auVar85);
            auVar57 = vsubps_avx(auVar85,auVar74);
            auVar16 = vsubps_avx(auVar85,auVar55);
            local_9e0 = vblendvps_avx(auVar55,auVar57,local_ba0);
            local_a00 = vblendvps_avx(auVar74,auVar16,local_ba0);
            fVar80 = local_bc0._0_4_;
            local_9a0._0_4_ = auVar20._0_4_ * fVar80;
            fVar81 = local_bc0._4_4_;
            local_9a0._4_4_ = auVar20._4_4_ * fVar81;
            fVar82 = local_bc0._8_4_;
            local_9a0._8_4_ = auVar20._8_4_ * fVar82;
            fVar68 = local_bc0._12_4_;
            local_9a0._12_4_ = auVar20._12_4_ * fVar68;
            fVar71 = local_bc0._16_4_;
            local_9a0._16_4_ = fVar71 * 0.0;
            fVar72 = local_bc0._20_4_;
            local_9a0._20_4_ = fVar72 * 0.0;
            fVar73 = local_bc0._24_4_;
            local_9a0._24_4_ = fVar73 * 0.0;
            local_9a0._28_4_ = 0;
            local_980._0_4_ = fVar80 * auVar21._0_4_;
            local_980._4_4_ = fVar81 * auVar21._4_4_;
            local_980._8_4_ = fVar82 * auVar21._8_4_;
            local_980._12_4_ = fVar68 * auVar21._12_4_;
            local_980._16_4_ = fVar71 * 0.0;
            local_980._20_4_ = fVar72 * 0.0;
            local_980._24_4_ = fVar73 * 0.0;
            local_980._28_4_ = 0;
            local_960._0_4_ = fVar80 * fVar2;
            local_960._4_4_ = fVar81 * fVar3;
            local_960._8_4_ = fVar82 * fVar14;
            local_960._12_4_ = fVar68 * fVar15;
            local_960._16_4_ = fVar71 * 0.0;
            local_960._20_4_ = fVar72 * 0.0;
            local_960._24_4_ = fVar73 * 0.0;
            local_960._28_4_ = 0;
            auVar54 = vpsllw_avx(auVar54,0xf);
            auVar54 = vpacksswb_avx(auVar54,auVar54);
            uVar46 = (ulong)(byte)(SUB161(auVar54 >> 7,0) & 1 | (SUB161(auVar54 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar54 >> 0x3f,0) << 7);
            do {
              local_c80 = auVar95._0_16_;
              uVar26 = 0;
              for (uVar45 = uVar46; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                uVar26 = uVar26 + 1;
              }
              uVar47 = *(uint *)((long)&local_b20 + uVar26 * 4);
              pGVar12 = (pSVar6->geometries).items[uVar47].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00579205:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  return bVar39;
                }
                local_c00 = auVar64._0_32_;
                uVar45 = (ulong)(uint)((int)uVar26 * 4);
                uVar4 = *(undefined4 *)(local_a00 + uVar45);
                local_8c0._4_4_ = uVar4;
                local_8c0._0_4_ = uVar4;
                local_8c0._8_4_ = uVar4;
                local_8c0._12_4_ = uVar4;
                local_8c0._16_4_ = uVar4;
                local_8c0._20_4_ = uVar4;
                local_8c0._24_4_ = uVar4;
                local_8c0._28_4_ = uVar4;
                local_8a0 = *(undefined4 *)(local_9e0 + uVar45);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_9c0 + uVar45);
                local_cd0.context = context->user;
                uVar4 = *(undefined4 *)((long)&local_b40 + uVar45);
                local_880._4_4_ = uVar4;
                local_880._0_4_ = uVar4;
                local_880._8_4_ = uVar4;
                local_880._12_4_ = uVar4;
                local_880._16_4_ = uVar4;
                local_880._20_4_ = uVar4;
                local_880._24_4_ = uVar4;
                local_880._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_9a0 + uVar45);
                uVar5 = *(undefined4 *)(local_980 + uVar45);
                local_900._4_4_ = uVar5;
                local_900._0_4_ = uVar5;
                local_900._8_4_ = uVar5;
                local_900._12_4_ = uVar5;
                local_900._16_4_ = uVar5;
                local_900._20_4_ = uVar5;
                local_900._24_4_ = uVar5;
                local_900._28_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_960 + uVar45);
                local_8e0._4_4_ = uVar5;
                local_8e0._0_4_ = uVar5;
                local_8e0._8_4_ = uVar5;
                local_8e0._12_4_ = uVar5;
                local_8e0._16_4_ = uVar5;
                local_8e0._20_4_ = uVar5;
                local_8e0._24_4_ = uVar5;
                local_8e0._28_4_ = uVar5;
                local_860._4_4_ = uVar47;
                local_860._0_4_ = uVar47;
                local_860._8_4_ = uVar47;
                local_860._12_4_ = uVar47;
                local_860._16_4_ = uVar47;
                local_860._20_4_ = uVar47;
                local_860._24_4_ = uVar47;
                local_860._28_4_ = uVar47;
                local_920[0] = (RTCHitN)(char)uVar4;
                local_920[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar4;
                local_920[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar4;
                local_920[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar4;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar4;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar4;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar4;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar4;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_cd0.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_cd0.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ca0 = local_be0;
                local_cd0.valid = (int *)local_ca0;
                local_cd0.geometryUserPtr = pGVar12->userPtr;
                local_cd0.hit = local_920;
                local_cd0.N = 8;
                local_cd0.ray = (RTCRayN *)ray;
                if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar12->occlusionFilterN)(&local_cd0);
                }
                auVar55 = vpcmpeqd_avx2(local_ca0,_DAT_01faff00);
                auVar74 = _DAT_01fe9960 & ~auVar55;
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar74 >> 0x7f,0) == '\0') &&
                      (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar74 >> 0xbf,0) == '\0') &&
                    (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar74[0x1f]) {
                  auVar55 = auVar55 ^ _DAT_01fe9960;
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var13)(&local_cd0);
                  }
                  auVar74 = vpcmpeqd_avx2(local_ca0,_DAT_01faff00);
                  auVar55 = auVar74 ^ _DAT_01fe9960;
                  auVar61._8_4_ = 0xff800000;
                  auVar61._0_8_ = 0xff800000ff800000;
                  auVar61._12_4_ = 0xff800000;
                  auVar61._16_4_ = 0xff800000;
                  auVar61._20_4_ = 0xff800000;
                  auVar61._24_4_ = 0xff800000;
                  auVar61._28_4_ = 0xff800000;
                  auVar74 = vblendvps_avx(auVar61,*(undefined1 (*) [32])(local_cd0.ray + 0x100),
                                          auVar74);
                  *(undefined1 (*) [32])(local_cd0.ray + 0x100) = auVar74;
                }
                if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar55 >> 0x7f,0) != '\0') ||
                      (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar55 >> 0xbf,0) != '\0') ||
                    (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar55[0x1f] < '\0') goto LAB_00579205;
                auVar64 = ZEXT3264(local_c00);
                *(int *)(ray + k * 4 + 0x100) = local_c00._0_4_;
                auVar95 = ZEXT1664(local_c80);
              }
              uVar46 = uVar46 ^ 1L << (uVar26 & 0x3f);
            } while (uVar46 != 0);
          }
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 != uVar52 - 8);
    }
    auVar65 = ZEXT1664(local_c10);
    auVar66 = ZEXT1664(local_c20);
    auVar67 = ZEXT1664(local_c30);
    auVar70 = ZEXT1664(local_c40);
    auVar75 = ZEXT1664(local_c50);
    auVar76 = ZEXT1664(local_c60);
    auVar64 = ZEXT1664(local_c70);
joined_r0x00578abd:
    bVar39 = puVar48 != &local_800;
    if (!bVar39) {
      return bVar39;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }